

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_findimgname(char *fname,int nifti_type)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *__dest;
  char *str;
  uint local_54;
  int first;
  char *ext;
  undefined1 local_3f;
  char acStack_3e [3];
  char extnia [5];
  char extzip [4];
  char elist [2] [5];
  char *imgname;
  char *basename;
  int nifti_type_local;
  char *fname_local;
  
  stack0xffffffffffffffc6 = 0x6d692e0069696e2e;
  _acStack_3e = 0x7a672e;
  stack0xffffffffffffffbd = 0x61696e2e;
  local_3f = 0;
  iVar1 = nifti_validfilename(fname);
  if (iVar1 != 0) {
    __s = nifti_makebasename(fname);
    sVar2 = strlen(__s);
    __dest = (char *)calloc(1,sVar2 + 8);
    if (__dest == (char *)0x0) {
      fprintf(_stderr,"** nifti_findimgname: failed to alloc imgname\n");
      free(__s);
    }
    else {
      str = nifti_find_file_extension(fname);
      if ((str != (char *)0x0) && (iVar1 = is_uppercase(str), iVar1 != 0)) {
        make_uppercase(extnia + 1);
        make_uppercase(extzip + 1);
        make_uppercase(acStack_3e);
        make_uppercase((char *)((long)&ext + 5));
      }
      if (nifti_type == 3) {
        strcpy(__dest,__s);
        strcat(__dest,(char *)((long)&ext + 5));
        iVar1 = nifti_fileexists(__dest);
        if (iVar1 != 0) {
          free(__s);
          return __dest;
        }
      }
      else {
        local_54 = (uint)(nifti_type != 1);
        strcpy(__dest,__s);
        strcat(__dest,extnia + (long)(int)local_54 * 5 + 1);
        iVar1 = nifti_fileexists(__dest);
        if (iVar1 != 0) {
          free(__s);
          return __dest;
        }
        strcat(__dest,acStack_3e);
        iVar1 = nifti_fileexists(__dest);
        if (iVar1 != 0) {
          free(__s);
          return __dest;
        }
        strcpy(__dest,__s);
        strcat(__dest,extnia + (long)(int)(1 - local_54) * 5 + 1);
        iVar1 = nifti_fileexists(__dest);
        if (iVar1 != 0) {
          free(__s);
          return __dest;
        }
        strcat(__dest,acStack_3e);
        iVar1 = nifti_fileexists(__dest);
        if (iVar1 != 0) {
          free(__s);
          return __dest;
        }
      }
      free(__s);
      free(__dest);
    }
  }
  return (char *)0x0;
}

Assistant:

char * nifti_findimgname(const char* fname , int nifti_type)
{
   /* store all extensions as strings, in case we need to go uppercase */
   char *basename, *imgname, elist[2][5] = { ".nii", ".img" };
   char  extzip[4] = ".gz";
   char  extnia[5] = ".nia";
   const char *ext;
   int   first;  /* first extension to use */

   /* check input file(s) for sanity */
   if( !nifti_validfilename(fname) ) return NULL;

   basename =  nifti_makebasename(fname);
   imgname = (char *)calloc(sizeof(char),strlen(basename)+8);
   if( !imgname ){
      fprintf(stderr,"** nifti_findimgname: failed to alloc imgname\n");
      free(basename);
      return NULL;
   }

   /* if we are looking for uppercase, apply the fact now */
   ext = nifti_find_file_extension(fname);
   if( ext && is_uppercase(ext) ) {
      make_uppercase(elist[0]);
      make_uppercase(elist[1]);
      make_uppercase(extzip);
      make_uppercase(extnia);
   }

   /* only valid extension for ASCII type is .nia, handle first */
   if( nifti_type == NIFTI_FTYPE_ASCII ){
      strcpy(imgname,basename);
      strcat(imgname,extnia);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }

   } else {

      /**- test for .nii and .img (don't assume input type from image type) */
      /**- if nifti_type = 1, check for .nii first, else .img first         */

      /* if we get 3 or more extensions, can make a loop here... */

      if (nifti_type == NIFTI_FTYPE_NIFTI1_1) first = 0; /* should match .nii */
      else                                    first = 1; /* should match .img */

      strcpy(imgname,basename);
      strcat(imgname,elist[first]);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#ifdef HAVE_ZLIB  /* then also check for .gz */
      strcat(imgname,extzip);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#endif

      /* failed to find image file with expected extension, try the other */

      strcpy(imgname,basename);
      strcat(imgname,elist[1-first]);  /* can do this with only 2 choices */
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#ifdef HAVE_ZLIB  /* then also check for .gz */
      strcat(imgname,extzip);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#endif
   }

   /**- if nothing has been found, return NULL */
   free(basename);
   free(imgname);
   return NULL;
}